

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void wasm::PostWalker<Creator,_wasm::Visitor<Creator,_void>_>::scan
               (Creator *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  _func_void_Creator_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                       ,0x103);
  case BlockId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitBlock,currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
LAB_009ac9e2:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,__function);
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) {
LAB_009ac5fd:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                  ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case IfId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitIf,currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_009ac9e2;
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,wasm::Visitor<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::OptimizeAddedConstants::createHelperIndexes()::Creator*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,wasm::Visitor<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Creator,_wasm::Visitor<Creator,_void>_>).
                     super_Walker<Creator,_wasm::Visitor<Creator,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_009ac54f;
  case LoopId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitLoop,currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_009ac9e2;
    }
    goto LAB_009abf20;
  case BreakId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitBreak,currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_009ac9e2;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,wasm::Visitor<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::OptimizeAddedConstants::createHelperIndexes()::Creator*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,wasm::Visitor<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Creator,_wasm::Visitor<Creator,_void>_>).
                     super_Walker<Creator,_wasm::Visitor<Creator,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_009abd84;
  case SwitchId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitSwitch,currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_009ac9e2;
    }
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
               (Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar4 = *(long *)(pEVar1 + 4);
    goto joined_r0x009abd7e;
  case CallId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitCall,currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_009ac9e2;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_009ac5fd;
        Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                  ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case CallIndirectId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitCallIndirect,currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_009ac9e2;
    }
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 2) <= uVar3 - 2) goto LAB_009ac5fd;
        Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                  ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
                   (Expression **)(pEVar1[1].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case LocalGetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitLocalGet,currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_009ac9e2;
    }
    break;
  case LocalSetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitLocalSet,currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac21b;
  case GlobalGetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitGlobalGet,currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_009ac9e2;
    }
    break;
  case GlobalSetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitGlobalSet,currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_009ac9e2;
    }
    goto LAB_009abf20;
  case LoadId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitLoad,currp);
    if (pEVar1->_id != LoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Load]";
      goto LAB_009ac9e2;
    }
    pEVar1 = pEVar1 + 3;
    goto LAB_009ac453;
  case StoreId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStore,currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac1e4;
  case ConstId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitConst,currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_009ac9e2;
    }
    break;
  case UnaryId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitUnary,currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac21b;
  case BinaryId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitBinary,currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac17b;
  case SelectId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitSelect,currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac42f;
  case DropId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitDrop,currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_009ac9e2;
    }
    goto LAB_009abfdc;
  case ReturnId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitReturn,currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_009ac9e2;
    }
    goto LAB_009abd75;
  case MemorySizeId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitMemorySize,currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_009ac9e2;
    }
    break;
  case MemoryGrowId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitMemoryGrow,currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_009ac9e2;
    }
    goto LAB_009abfdc;
  case NopId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitNop,currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_009ac9e2;
    }
    break;
  case UnreachableId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitUnreachable,currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_009ac9e2;
    }
    break;
  case AtomicRMWId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitAtomicRMW,currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac260;
  case AtomicCmpxchgId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitAtomicCmpxchg,currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac251;
  case AtomicWaitId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitAtomicWait,currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_009ac9e2;
    }
    goto LAB_009abf41;
  case AtomicNotifyId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitAtomicNotify,currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac17b;
  case AtomicFenceId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitAtomicFence,currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_009ac9e2;
    }
    break;
  case SIMDExtractId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitSIMDExtract,currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac21b;
  case SIMDReplaceId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitSIMDReplace,currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_009ac9e2;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_009ac186;
  case SIMDShuffleId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitSIMDShuffle,currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac43e;
  case SIMDTernaryId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitSIMDTernary,currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_009ac9e2;
    }
    goto LAB_009abf41;
  case SIMDShiftId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitSIMDShift,currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac17b;
  case SIMDLoadId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitSIMDLoad,currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac100;
  case SIMDLoadStoreLaneId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitSIMDLoadStoreLane,currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_009ac9e2;
    }
LAB_009ac1e4:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_009ac453;
  case MemoryInitId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitMemoryInit,currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac251;
  case DataDropId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitDataDrop,currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_009ac9e2;
    }
    break;
  case MemoryCopyId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitMemoryCopy,currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac42f;
  case MemoryFillId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitMemoryFill,currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac42f;
  case PopId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitPop,currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_009ac9e2;
    }
    break;
  case RefNullId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitRefNull,currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_009ac9e2;
    }
    break;
  case RefIsNullId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitRefIsNull,currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_009ac9e2;
    }
    goto LAB_009abfdc;
  case RefFuncId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitRefFunc,currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_009ac9e2;
    }
    break;
  case RefEqId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitRefEq,currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac43e;
  case TableGetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitTableGet,currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_009ac9e2;
    }
    goto LAB_009abf20;
  case TableSetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitTableSet,currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac260;
  case TableSizeId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitTableSize,currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_009ac9e2;
    }
    break;
  case TableGrowId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitTableGrow,currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac260;
  case TableFillId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitTableFill,currp);
    if (pEVar1->_id != TableFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableFill]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac251;
  case TableCopyId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitTableCopy,currp);
    if (pEVar1->_id != TableCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableCopy]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac42f;
  case TableInitId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitTableInit,currp);
    if (pEVar1->_id != TableInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableInit]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac251;
  case TryId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitTry,currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_009ac9e2;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 5) <= uVar3 - 2) goto LAB_009ac5fd;
        Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                  ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
                   (Expression **)(pEVar1[4].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
LAB_009abf20:
    pEVar1 = pEVar1 + 2;
    goto LAB_009ac453;
  case TryTableId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitTryTable,currp);
    if (pEVar1->_id != TryTableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TryTable]";
      goto LAB_009ac9e2;
    }
    goto LAB_009abfdc;
  case ThrowId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitThrow,currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_009ac9e2;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_009ac5fd;
        Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                  ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RethrowId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitRethrow,currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_009ac9e2;
    }
    break;
  case ThrowRefId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitThrowRef,currp);
    if (pEVar1->_id != ThrowRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ThrowRef]";
      goto LAB_009ac9e2;
    }
    goto LAB_009abfdc;
  case TupleMakeId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitTupleMake,currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_009ac9e2;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_009ac5fd;
        Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                  ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case TupleExtractId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitTupleExtract,currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_009ac9e2;
    }
    goto LAB_009abfdc;
  case RefI31Id:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitRefI31,currp);
    if (pEVar1->_id != RefI31Id) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefI31]";
      goto LAB_009ac9e2;
    }
    goto LAB_009abfdc;
  case I31GetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitI31Get,currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_009ac9e2;
    }
    goto LAB_009abfdc;
  case CallRefId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitCallRef,currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_009ac9e2;
    }
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_009ac5fd;
        Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                  ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RefTestId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitRefTest,currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_009ac9e2;
    }
    goto LAB_009abfdc;
  case RefCastId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitRefCast,currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_009ac9e2;
    }
    goto LAB_009abfdc;
  case BrOnId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitBrOn,currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_009ac9e2;
    }
LAB_009ac100:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_009ac453;
  case StructNewId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStructNew,currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_009ac9e2;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_009ac5fd;
        Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                  ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case StructGetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStructGet,currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac21b;
  case StructSetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStructSet,currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac17b;
  case StructRMWId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStructRMW,currp);
    if (pEVar1->_id != StructRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructRMW]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac17b;
  case StructCmpxchgId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStructCmpxchg,currp);
    if (pEVar1->_id != StructCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructCmpxchg]";
      goto LAB_009ac9e2;
    }
LAB_009abf41:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_009ac186;
  case ArrayNewId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitArrayNew,currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_009ac9e2;
    }
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
               (Expression **)&pEVar1[1].type);
LAB_009abd75:
    local_38 = pEVar1 + 1;
    lVar4 = *(long *)(pEVar1 + 1);
joined_r0x009abd7e:
    if (lVar4 != 0) {
LAB_009abd84:
      local_40 = scan;
      SmallVector<wasm::Walker<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,wasm::Visitor<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::OptimizeAddedConstants::createHelperIndexes()::Creator*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,wasm::Visitor<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Creator,_wasm::Visitor<Creator,_void>_>).
                     super_Walker<Creator,_wasm::Visitor<Creator,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    break;
  case ArrayNewDataId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitArrayNewData,currp);
    if (pEVar1->_id != ArrayNewDataId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewData]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac260;
  case ArrayNewElemId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitArrayNewElem,currp);
    if (pEVar1->_id != ArrayNewElemId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewElem]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac260;
  case ArrayNewFixedId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitArrayNewFixed,currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_009ac9e2;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_009ac5fd;
        Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                  ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ArrayGetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitArrayGet,currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac43e;
  case ArraySetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitArraySet,currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac42f;
  case ArrayLenId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitArrayLen,currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_009ac9e2;
    }
    goto LAB_009abfdc;
  case ArrayCopyId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitArrayCopy,currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_009ac9e2;
    }
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_009ac420;
  case ArrayFillId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitArrayFill,currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_009ac9e2;
    }
LAB_009ac420:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    goto LAB_009ac42f;
  case ArrayInitDataId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitArrayInitData,currp);
    if (pEVar1->_id != ArrayInitDataId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInitData]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ab850;
  case ArrayInitElemId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitArrayInitElem,currp);
    if (pEVar1->_id != ArrayInitElemId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInitElem]";
      goto LAB_009ac9e2;
    }
LAB_009ab850:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
LAB_009ac251:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
LAB_009ac260:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_009ac453;
  case RefAsId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitRefAs,currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac21b;
  case StringNewId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStringNew,currp);
    if (pEVar1->_id != StringNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
      goto LAB_009ac9e2;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,wasm::Visitor<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::OptimizeAddedConstants::createHelperIndexes()::Creator*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,wasm::Visitor<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Creator,_wasm::Visitor<Creator,_void>_>).
                     super_Walker<Creator,_wasm::Visitor<Creator,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,wasm::Visitor<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::OptimizeAddedConstants::createHelperIndexes()::Creator*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,wasm::Visitor<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Creator,_wasm::Visitor<Creator,_void>_>).
                     super_Walker<Creator,_wasm::Visitor<Creator,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_009ac54f;
  case StringConstId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStringConst,currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_009ac9e2;
    }
    break;
  case StringMeasureId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStringMeasure,currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_009ac9e2;
    }
LAB_009ac21b:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_009ac453;
  case StringEncodeId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStringEncode,currp);
    if (pEVar1->_id != StringEncodeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
      goto LAB_009ac9e2;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,wasm::Visitor<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::OptimizeAddedConstants::createHelperIndexes()::Creator*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,wasm::Visitor<wasm::OptimizeAddedConstants::createHelperIndexes()::Creator,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Creator,_wasm::Visitor<Creator,_void>_>).
                     super_Walker<Creator,_wasm::Visitor<Creator,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 2));
    pEVar1 = (Expression *)&pEVar1[1].type;
LAB_009ac54f:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,(Expression **)pEVar1);
    break;
  case StringConcatId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStringConcat,currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac43e;
  case StringEqId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStringEq,currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_009ac9e2;
    }
LAB_009ac17b:
    currp_00 = pEVar1 + 2;
LAB_009ac186:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,(Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_009ac453;
  case StringWTF16GetId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStringWTF16Get,currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_009ac9e2;
    }
    goto LAB_009ac43e;
  case StringSliceWTFId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStringSliceWTF,currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_009ac9e2;
    }
LAB_009ac42f:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 2));
LAB_009ac43e:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_009ac453;
  case ContNewId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitContNew,currp);
    if (pEVar1->_id != ContNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ContNew]";
      goto LAB_009ac9e2;
    }
LAB_009abfdc:
    pEVar1 = pEVar1 + 1;
LAB_009ac453:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,(Expression **)pEVar1);
    return;
  case ContBindId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitContBind,currp);
    if (pEVar1->_id != ContBindId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ContBind]";
      goto LAB_009ac9e2;
    }
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_009ac5fd;
        Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                  ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case SuspendId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitSuspend,currp);
    if (pEVar1->_id != SuspendId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Suspend]";
      goto LAB_009ac9e2;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_009ac5fd;
        Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                  ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ResumeId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitResume,currp);
    if (pEVar1->_id != ResumeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Resume]";
      goto LAB_009ac9e2;
    }
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 7));
    uVar2 = (uint)pEVar1[5].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[5].type.id <= uVar3 - 2) goto LAB_009ac5fd;
        Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                  ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 5) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ResumeThrowId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitResumeThrow,currp);
    if (pEVar1->_id != ResumeThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ResumeThrow]";
      goto LAB_009ac9e2;
    }
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 8));
    uVar2 = (uint)pEVar1[6].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[6].type.id <= uVar3 - 2) goto LAB_009ac5fd;
        Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                  ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 6) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case StackSwitchId:
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,
               Walker<Creator,_wasm::Visitor<Creator,_void>_>::doVisitStackSwitch,currp);
    if (pEVar1->_id != StackSwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StackSwitch]";
      goto LAB_009ac9e2;
    }
    Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
              ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 4));
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_009ac5fd;
        Walker<Creator,_wasm::Visitor<Creator,_void>_>::pushTask
                  ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }